

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1d6630d::
MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>
::TearDown(MainTestClass<void_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_unsigned_int_*,_int_*,_unsigned_int_*)>
           *this)

{
  uint8_t *memblk;
  
  memblk = this->src_;
  if ((this->params_).use_high_bit_depth == true) {
    memblk = (uint8_t *)((long)memblk * 2);
    this->src_ = memblk;
    this->ref_ = (uint8_t *)((long)this->ref_ << 1);
  }
  aom_free(memblk);
  if (this->ref_ != (uint8_t *)0x0) {
    operator_delete__(this->ref_);
  }
  this->src_ = (uint8_t *)0x0;
  this->ref_ = (uint8_t *)0x0;
  return;
}

Assistant:

void TearDown() override {
    if (use_high_bit_depth()) {
      // TODO(skal): remove!
      src_ = reinterpret_cast<uint8_t *>(CONVERT_TO_SHORTPTR(src_));
      ref_ = reinterpret_cast<uint8_t *>(CONVERT_TO_SHORTPTR(ref_));
    }

    aom_free(src_);
    delete[] ref_;
    src_ = nullptr;
    ref_ = nullptr;
  }